

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_int8.h
# Opt level: O2

void ncnn::conv1x1s1_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  vector<float,_std::allocator<float>_> scale_requant;
  pointer in_stack_ffffffffffffffb8;
  Option *in_stack_ffffffffffffffc0;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&stack0xffffffffffffffb8,scales_requant);
  scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)opt;
  scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&stack0xffffffffffffffb8;
  scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffffb8;
  conv_im2col_sgemm_int8_requant_sse
            (bottom_blob,top_blob,_kernel,1,1,1,1,_bias,scale_requant,in_stack_ffffffffffffffc0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

static void conv1x1s1_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_requant, const Option& opt)
{
    int kernel_w = 1;
    int kernel_h = 1;

    int stride_w = 1;
    int stride_h = 1;

    conv_im2col_sgemm_int8_requant_sse(bottom_blob, top_blob, _kernel, kernel_w, kernel_h, stride_w, stride_h, _bias, scales_requant, opt);
}